

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::anon_unknown_37::IsGlobPattern(string *pattern)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  
  pcVar3 = (pattern->_M_dataplus)._M_p;
  uVar2 = pattern->_M_string_length;
  pcVar1 = pcVar3 + uVar2;
  pcVar4 = pcVar3;
  if (0 < (long)uVar2 >> 2) {
    pcVar4 = pcVar3 + (uVar2 & 0xfffffffffffffffc);
    lVar5 = ((long)uVar2 >> 2) + 1;
    pcVar3 = pcVar3 + 3;
    do {
      if ((pcVar3[-3] == '*') || (pcVar3[-3] == '?')) {
        pcVar3 = pcVar3 + -3;
        goto LAB_0012e532;
      }
      if ((pcVar3[-2] == '*') || (pcVar3[-2] == '?')) {
        pcVar3 = pcVar3 + -2;
        goto LAB_0012e532;
      }
      if ((pcVar3[-1] == '*') || (pcVar3[-1] == '?')) {
        pcVar3 = pcVar3 + -1;
        goto LAB_0012e532;
      }
      if ((*pcVar3 == '*') || (*pcVar3 == '?')) goto LAB_0012e532;
      lVar5 = lVar5 + -1;
      pcVar3 = pcVar3 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar1 - (long)pcVar4;
  if (lVar5 != 1) {
    pcVar3 = pcVar4;
    if (lVar5 != 2) {
      pcVar3 = pcVar1;
      if (((lVar5 != 3) || (pcVar3 = pcVar4, *pcVar4 == '*')) || (*pcVar4 == '?'))
      goto LAB_0012e532;
      pcVar3 = pcVar4 + 1;
    }
    if ((*pcVar3 == '*') || (*pcVar3 == '?')) goto LAB_0012e532;
    pcVar4 = pcVar3 + 1;
  }
  pcVar3 = pcVar4;
  if ((*pcVar4 != '*') && (*pcVar4 != '?')) {
    pcVar3 = pcVar1;
  }
LAB_0012e532:
  return pcVar3 != pcVar1;
}

Assistant:

bool IsGlobPattern(const std::string& pattern) {
  return std::any_of(pattern.begin(), pattern.end(),
                     [](const char c) { return c == '?' || c == '*'; });
}